

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O3

void __thiscall despot::RegDemo::RegDemo(RegDemo *this,string *params_file)

{
  ifstream fin;
  istream aiStack_238 [520];
  
  despot::DSPOMDP::DSPOMDP(&this->super_DSPOMDP);
  *(undefined8 *)&this->field_0x30 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined ***)this = &PTR__RegDemo_0010dad0;
  *(undefined ***)&this->super_MDP = &PTR__RegDemo_0010dbe0;
  *(undefined ***)&this->super_StateIndexer = &PTR__RegDemo_0010dc30;
  *(undefined ***)&this->super_StatePolicy = &PTR__RegDemo_0010dc68;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&this->trap_prob_,0,0x94);
  std::ifstream::ifstream(aiStack_238,(params_file->_M_dataplus)._M_p,_S_in);
  Init(this,aiStack_238);
  std::ifstream::close();
  std::ifstream::~ifstream(aiStack_238);
  return;
}

Assistant:

RegDemo::RegDemo(string params_file) {
	ifstream fin(params_file.c_str(), ifstream::in);
	Init(fin);
	fin.close();
}